

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPile.cpp
# Opt level: O2

unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
 __thiscall solitaire::piles::FoundationPile::createSnapshot(FoundationPile *this)

{
  long in_RSI;
  undefined1 local_30 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<solitaire::piles::FoundationPile,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<solitaire::piles::FoundationPile,void>
            ((__shared_ptr<solitaire::piles::FoundationPile,(__gnu_cxx::_Lock_policy)2> *)
             (local_30 + 8),
             (__weak_ptr<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2> *)
             (in_RSI + 8));
  std::
  make_unique<solitaire::piles::FoundationPile::Snapshot,std::shared_ptr<solitaire::piles::FoundationPile>,std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>&>
            ((shared_ptr<solitaire::piles::FoundationPile> *)local_30,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             (local_30 + 8));
  (this->super_FoundationPile).super_Archiver._vptr_Archiver = (_func_int **)local_30._0_8_;
  local_30._0_8_ = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return (__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
          )(__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<archivers::interfaces::Snapshot> FoundationPile::createSnapshot() {
    return std::make_unique<Snapshot>(shared_from_this(), cards);
}